

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_gesture.cpp
# Opt level: O0

void Am_Gesture_Stop_Method_proc
               (Am_Object *inter,Am_Object *object,Am_Object *event_window,Am_Input_Event *ev)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  Am_Value *pAVar4;
  ostream *poVar5;
  undefined1 local_e0 [8];
  Am_Inter_Internal_Method inter_method;
  Am_Object local_c8;
  Am_Input_Char local_bc;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  undefined1 local_90 [8];
  Am_Value gesture_name;
  Am_Object chosen_command_obj;
  Am_Object local_70;
  Am_Input_Char local_64;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48 [3];
  Am_Object local_30;
  Am_Object inter_command_obj;
  Am_Input_Event *ev_local;
  Am_Object *event_window_local;
  Am_Object *object_local;
  Am_Object *inter_local;
  
  inter_command_obj.data = (Am_Object_Data *)ev;
  Am_Object::Am_Object(&local_30);
  pAVar4 = Am_Object::Get(inter,0xc5,0);
  Am_Object::operator=(&local_30,pAVar4);
  Am_Object::Am_Object(local_48,inter);
  bVar3 = Am_Inter_Tracing(local_48);
  Am_Object::~Am_Object(local_48);
  if (bVar3) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Gesture stopping over ");
    poVar5 = operator<<(poVar5,object);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  Am_Object::Am_Object(&local_50,inter);
  Am_Object::Am_Object(&local_58,&local_30);
  iVar1 = *(int *)&(inter_command_obj.data)->prototype;
  iVar2 = *(int *)((long)&(inter_command_obj.data)->prototype + 4);
  Am_Object::Am_Object(&local_60,event_window);
  local_64 = *(Am_Input_Char *)
              &((inter_command_obj.data)->super_Am_Wrapper).super_Am_Registered_Type.
               _vptr_Am_Registered_Type;
  gesture_new_point(&local_50,&local_58,iVar1,iVar2,&local_60,local_64);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_50);
  Am_Object::Am_Object(&local_70,inter);
  gesture_stop(&local_70);
  Am_Object::~Am_Object(&local_70);
  Am_Object::Am_Object(&chosen_command_obj,inter);
  gesture_classify(&chosen_command_obj);
  Am_Object::~Am_Object(&chosen_command_obj);
  Am_Object::Am_Object((Am_Object *)&gesture_name.value);
  Am_Value::Am_Value((Am_Value *)local_90);
  Am_Object::Am_Object(&local_a0,inter);
  choose_command_obj(&local_98);
  Am_Object::operator=((Am_Object *)&gesture_name.value,&local_98);
  Am_Object::~Am_Object(&local_98);
  Am_Object::~Am_Object(&local_a0);
  pAVar4 = Am_Object::Peek(inter,0x169,0);
  Am_Value::operator=((Am_Value *)local_90,pAVar4);
  Am_Object::Set((Am_Object *)&gesture_name.value,0x169,(Am_Value *)local_90,0);
  Am_Object::Am_Object(&local_a8,inter);
  Am_Object::Am_Object(&local_b0,(Am_Object *)&gesture_name.value);
  iVar1 = *(int *)&(inter_command_obj.data)->prototype;
  iVar2 = *(int *)((long)&(inter_command_obj.data)->prototype + 4);
  Am_Object::Am_Object(&local_b8,event_window);
  local_bc = *(Am_Input_Char *)
              &((inter_command_obj.data)->super_Am_Wrapper).super_Am_Registered_Type.
               _vptr_Am_Registered_Type;
  Am_Object::Am_Object(&local_c8,object);
  Am_Inter_Location::Am_Inter_Location((Am_Inter_Location *)&inter_method.Call,&Am_No_Location);
  Am_Call_Final_Do_And_Register
            (&local_a8,&local_b0,iVar1,iVar2,&local_b8,local_bc,&local_c8,
             (Am_Inter_Location *)&inter_method.Call,gesture_set_impl_command);
  Am_Inter_Location::~Am_Inter_Location((Am_Inter_Location *)&inter_method.Call);
  Am_Object::~Am_Object(&local_c8);
  Am_Object::~Am_Object(&local_b8);
  Am_Object::~Am_Object(&local_b0);
  Am_Object::~Am_Object(&local_a8);
  Am_Inter_Internal_Method::Am_Inter_Internal_Method((Am_Inter_Internal_Method *)local_e0);
  pAVar4 = Am_Object::Get(&Am_Interactor,0xc2,0);
  Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)local_e0,pAVar4);
  (*(code *)inter_method.from_wrapper)(inter,object,event_window,inter_command_obj.data);
  Am_Value::~Am_Value((Am_Value *)local_90);
  Am_Object::~Am_Object((Am_Object *)&gesture_name.value);
  Am_Object::~Am_Object(&local_30);
  return;
}

Assistant:

Am_Define_Method(Am_Inter_Internal_Method, void, Am_Gesture_Stop_Method,
                 (Am_Object & inter, Am_Object &object, Am_Object &event_window,
                  Am_Input_Event *ev))
{
  Am_Object inter_command_obj;
  inter_command_obj = inter.Get(Am_COMMAND);

  if (Am_Inter_Tracing(inter))
    std::cout << "Gesture stopping over " << object << std::endl;

  // get last point
  gesture_new_point(inter, inter_command_obj, ev->x, ev->y, event_window,
                    ev->input_char);
  gesture_stop(inter);

  // classify the gesture and store its name in Am_VALUE
  gesture_classify(inter);

  // choose the appropriate command object to invoke (either from Am_ITEMS
  // list or from Am_COMMAND slot) and store the gesture name in its Am_VALUE
  Am_Object chosen_command_obj;
  Am_Value gesture_name;
  chosen_command_obj = choose_command_obj(inter);
  gesture_name = inter.Peek(Am_VALUE);
  chosen_command_obj.Set(Am_VALUE, gesture_name);

  // invoke the Do methods and register for undo
  Am_Call_Final_Do_And_Register(inter, chosen_command_obj, ev->x, ev->y,
                                event_window, ev->input_char, object,
                                Am_No_Location, gesture_set_impl_command);

  // LAST, call our prototype's method
  Am_Inter_Internal_Method inter_method;
  inter_method = Am_Interactor.Get(Am_INTER_STOP_METHOD);
  inter_method.Call(inter, object, event_window, ev);
}